

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Appearance_PDU::Appearance_PDU(Appearance_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Appearance_PDU *this_local;
  
  LE_Header::LE_Header(&this->super_LE_Header);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Appearance_PDU_0032e360;
  DATA_TYPE::EntityType::EntityType(&this->m_EntityType);
  DATA_TYPE::EntityType::EntityType(&this->m_AltEntityType);
  DATA_TYPE::EntityMarking::EntityMarking(&this->m_EntityMarking);
  DATA_TYPE::EntityCapabilities::EntityCapabilities(&this->m_EntityCapabilities);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_VisApp);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_IRApp);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EMApp);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_AudApp);
  (*(this->super_LE_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Appearance_PDU::Appearance_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}